

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::IteratorGenerator<std::pair<std::__cxx11::string_const,unsigned_long>>::
IteratorGenerator<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          (IteratorGenerator<std::pair<std::__cxx11::string_const,unsigned_long>> *this,
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
          first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                last)

{
  bool bVar1;
  GeneratorException local_58 [2];
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_31;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_28;
  IteratorGenerator<std::pair<std::__cxx11::string_const,unsigned_long>> *local_20;
  IteratorGenerator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *this_local;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  last_local;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  first_local;
  
  local_20 = this;
  this_local = (IteratorGenerator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                *)last._M_node;
  last_local = first;
  IGenerator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::IGenerator((IGenerator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                *)this);
  *(undefined ***)this = &PTR__IteratorGenerator_0040c0b0;
  local_28._M_node = last_local._M_node;
  local_30._M_node = (_Base_ptr)this_local;
  CLI::std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::allocator(&local_31);
  std::
  vector<std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::vector<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,unsigned_long>>,void>
            ((vector<std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              *)(this + 8),local_28,local_30,&local_31);
  CLI::std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::~allocator(&local_31);
  *(undefined8 *)(this + 0x20) = 0;
  bVar1 = CLI::std::
          vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::empty((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)(this + 8));
  if (!bVar1) {
    return;
  }
  GeneratorException::GeneratorException(local_58,"IteratorGenerator received no valid values");
  throw_exception<Catch::GeneratorException>(local_58);
}

Assistant:

IteratorGenerator(InputIterator first, InputSentinel last):m_elems(first, last) {
        if (m_elems.empty()) {
            Catch::throw_exception(GeneratorException("IteratorGenerator received no valid values"));
        }
    }